

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessageCommand.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1034035::ReportCheckResult
          (anon_unknown_dwarf_1034035 *this,string_view what,string *result,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmake *pcVar3;
  undefined8 *puVar4;
  cmMessenger *this_00;
  undefined8 *puVar5;
  ulong *puVar6;
  undefined8 uVar7;
  anon_unknown_dwarf_1034035 *paVar8;
  _Alloc_hider _Var9;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> text;
  string local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  undefined8 local_70;
  char *local_68;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  puVar6 = (ulong *)what._M_str;
  pcVar3 = cmMakefile::GetCMakeInstance((cmMakefile *)result);
  if ((pcVar3->CheckInProgressMessages).c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (pcVar3->CheckInProgressMessages).c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    this_00 = cmMakefile::GetMessenger((cmMakefile *)result);
    local_90._M_len = 8;
    local_90._M_str = "Ignored ";
    local_70 = 0x14;
    local_68 = " without CHECK_START";
    views._M_len = 3;
    views._M_array = &local_90;
    local_80._M_allocated_capacity = (size_type)this;
    local_80._8_8_ = what._M_len;
    cmCatViews_abi_cxx11_(&local_b0,views);
    cmMakefile::GetBacktrace((cmMakefile *)result);
    cmMessenger::DisplayMessage(this_00,AUTHOR_WARNING,&local_b0,(cmListFileBacktrace *)&local_90);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_str !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_str);
    }
    uVar7 = local_b0.field_2._M_allocated_capacity;
    _Var9._M_p = local_b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
      return;
    }
    goto LAB_00339052;
  }
  pcVar3 = cmMakefile::GetCMakeInstance((cmMakefile *)result);
  cmake::GetTopCheckInProgressMessage_abi_cxx11_((string *)&local_40,pcVar3);
  puVar4 = (undefined8 *)std::__cxx11::string::append(local_40._M_local_buf);
  paVar2 = &local_b0.field_2;
  puVar5 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar5) {
    local_b0.field_2._M_allocated_capacity = *puVar5;
    local_b0.field_2._8_8_ = puVar4[3];
    local_b0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *puVar5;
    local_b0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_b0._M_string_length = puVar4[1];
  *puVar4 = puVar5;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  uVar7 = (anon_unknown_dwarf_1034035 *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    uVar7 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar7 < (anon_unknown_dwarf_1034035 *)(puVar6[1] + local_b0._M_string_length)) {
    paVar8 = (anon_unknown_dwarf_1034035 *)0xf;
    if ((ulong *)*puVar6 != puVar6 + 2) {
      paVar8 = (anon_unknown_dwarf_1034035 *)puVar6[2];
    }
    if (paVar8 < (anon_unknown_dwarf_1034035 *)(puVar6[1] + local_b0._M_string_length))
    goto LAB_00338f09;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)puVar6,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
  }
  else {
LAB_00338f09:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,*puVar6);
  }
  local_90._M_len = (size_t)&local_80;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 == paVar1) {
    local_80._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_80._8_8_ = puVar4[3];
  }
  else {
    local_80._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_90._M_len = (size_t)*puVar4;
  }
  local_90._M_str = (char *)puVar4[1];
  *puVar4 = paVar1;
  puVar4[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_allocated_capacity != &local_30) {
    operator_delete((void *)local_40._M_allocated_capacity,local_30._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_len == &local_80) {
    local_60.field_2._8_8_ = local_80._8_8_;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60._M_dataplus._M_p = (pointer)local_90._M_len;
  }
  local_60.field_2._M_allocated_capacity = local_80._M_allocated_capacity;
  local_60._M_string_length = (size_type)local_90._M_str;
  local_90._M_str = (char *)0x0;
  local_80._M_allocated_capacity = local_80._M_allocated_capacity & 0xffffffffffffff00;
  local_90._M_len = (size_t)&local_80;
  IndentText(&local_b0,&local_60,(cmMakefile *)result);
  cmMakefile::DisplayStatus((cmMakefile *)result,&local_b0,-1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  uVar7 = local_80._M_allocated_capacity;
  _Var9._M_p = (pointer)local_90._M_len;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_len == &local_80) {
    return;
  }
LAB_00339052:
  operator_delete(_Var9._M_p,(ulong)(uVar7 + 1));
  return;
}

Assistant:

void ReportCheckResult(cm::string_view what, std::string result,
                       cmMakefile& mf)
{
  if (mf.GetCMakeInstance()->HasCheckInProgress()) {
    auto text = mf.GetCMakeInstance()->GetTopCheckInProgressMessage() + " - " +
      std::move(result);
    mf.DisplayStatus(IndentText(std::move(text), mf), -1);
  } else {
    mf.GetMessenger()->DisplayMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat("Ignored "_s, what, " without CHECK_START"_s),
      mf.GetBacktrace());
  }
}